

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O0

c_v256 * c_v256_zip_32(c_v128 a,c_v128 b)

{
  c_v128 a_00;
  c_v128 a_01;
  undefined8 in_RCX;
  undefined8 in_RDX;
  c_v256 *in_RDI;
  c_v128 cVar1;
  c_v128 cVar2;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  
  a_00.u64[1] = in_RCX;
  a_00.u64[0] = in_stack_ffffffffffffffa8;
  cVar1.u64[1] = in_stack_ffffffffffffffa0;
  cVar1.u64[0] = in_stack_ffffffffffffff98;
  cVar1 = c_v128_ziphi_32(a_00,cVar1);
  a_01.u64[1] = in_RCX;
  a_01.u64[0] = in_stack_ffffffffffffffa8;
  cVar2.u64[1] = in_stack_ffffffffffffffa0;
  cVar2.u64[0] = in_RDX;
  cVar2 = c_v128_ziplo_32(a_01,cVar2);
  c_v256_from_v128(in_RDI,cVar1,cVar2);
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_zip_32(c_v128 a, c_v128 b) {
  return c_v256_from_v128(c_v128_ziphi_32(a, b), c_v128_ziplo_32(a, b));
}